

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall
Transaction_CommitEmptyDoesNothing_Test::~Transaction_CommitEmptyDoesNothing_Test
          (Transaction_CommitEmptyDoesNothing_Test *this)

{
  Transaction_CommitEmptyDoesNothing_Test *this_local;
  
  ~Transaction_CommitEmptyDoesNothing_Test(this);
  operator_delete(this,0x1e0);
  return;
}

Assistant:

TEST_F (Transaction, CommitEmptyDoesNothing) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    // A quick check of the initial state.
    auto header = this->get_header ();
    ASSERT_EQ (pstore::leader_size, header->footer_pos.load ().absolute ());

    {
        mock_mutex mutex;
        auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});
        transaction.commit ();
    }

    EXPECT_EQ (pstore::leader_size, header->footer_pos.load ().absolute ());
}